

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

void __thiscall RenX::Server::banCheck(Server *this,PlayerInfo *player)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  Entry *pEVar4;
  duration dVar5;
  uint64_t uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  size_type sVar9;
  bool bVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *pvVar14;
  long lVar15;
  size_type sVar16;
  PlayerInfo *pPVar17;
  tm *ptVar18;
  PlayerInfo *pPVar19;
  undefined8 uVar20;
  long lVar21;
  size_t sVar22;
  undefined8 *puVar23;
  pointer puVar24;
  PlayerInfo *extraout_RDX;
  PlayerInfo *pPVar25;
  PlayerInfo *extraout_RDX_03;
  PlayerInfo *extraout_RDX_06;
  PlayerInfo *extraout_RDX_09;
  PlayerInfo *extraout_RDX_12;
  PlayerInfo *extraout_RDX_14;
  size_type __rlen;
  PlayerInfo *pPVar26;
  pointer puVar27;
  undefined8 *puVar28;
  PlayerInfo *pPVar29;
  PlayerInfo *pPVar30;
  PlayerInfo *pPVar31;
  PlayerInfo *pPVar32;
  PlayerInfo *pPVar33;
  Server *pSVar34;
  undefined8 *puVar35;
  undefined1 auVar36 [16];
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string_view in_reason;
  string_view message;
  string_view in_reason_00;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string fmtName;
  time_t current_time;
  string channel_message;
  char timeStr [256];
  string local_1c0;
  pointer local_1a0;
  PlayerInfo *local_198;
  PlayerInfo *local_190;
  PlayerInfo *local_188;
  Server *local_180;
  string local_178;
  string local_158;
  basic_string_view<char,_std::char_traits<char>_> local_138 [16];
  PlayerInfo *extraout_RDX_00;
  PlayerInfo *extraout_RDX_01;
  PlayerInfo *extraout_RDX_02;
  PlayerInfo *extraout_RDX_04;
  PlayerInfo *extraout_RDX_05;
  PlayerInfo *extraout_RDX_07;
  PlayerInfo *extraout_RDX_08;
  PlayerInfo *extraout_RDX_10;
  PlayerInfo *extraout_RDX_11;
  PlayerInfo *extraout_RDX_13;
  
  if ((player->exemption_flags & 6) == 0) {
    local_180 = this;
    pvVar14 = BanDatabase::getEntries((BanDatabase *)banDatabase);
    puVar27 = (pvVar14->
              super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar24 = (pvVar14->
              super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (puVar27 == puVar24) {
      pPVar26 = (PlayerInfo *)0x0;
      pPVar32 = (PlayerInfo *)0x0;
      pPVar17 = (PlayerInfo *)0x0;
      pPVar30 = (PlayerInfo *)0x0;
      pPVar29 = (PlayerInfo *)0x0;
      local_190 = (PlayerInfo *)0x0;
      pPVar25 = extraout_RDX;
      pPVar19 = (PlayerInfo *)0x0;
    }
    else {
      pPVar26 = (PlayerInfo *)0x0;
      pPVar32 = (PlayerInfo *)0x0;
      pPVar17 = (PlayerInfo *)0x0;
      pPVar30 = (PlayerInfo *)0x0;
      pPVar29 = (PlayerInfo *)0x0;
      pPVar25 = (PlayerInfo *)0x0;
      local_190 = (PlayerInfo *)0x0;
      local_1a0 = puVar24;
      do {
        pEVar4 = (puVar27->_M_t).
                 super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                 .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
        pPVar19 = local_190;
        if ((short)pEVar4->flags < 0) {
          lVar21 = (pEVar4->length).__r;
          local_198 = pPVar29;
          local_188 = pPVar30;
          if ((lVar21 == 0) ||
             (dVar5.__r = (pEVar4->timestamp).__d.__r,
             lVar15 = std::chrono::_V2::system_clock::now(),
             lVar15 <= lVar21 * 1000000000 + dVar5.__r)) {
            bVar1 = ((puVar27->_M_t).
                     super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                     .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl)->
                    prefix_length;
            uVar12 = 0xffffffff;
            if (bVar1 < 0x20) {
              uVar12 = Jupiter_prefix_length_to_netmask(bVar1);
            }
            if ((((local_180->m_localSteamBan == true) &&
                 (uVar6 = ((puVar27->_M_t).
                           super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                           .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl)->
                          steamid, uVar6 != 0)) && (uVar6 == player->steamid)) ||
               (((local_180->m_localIPBan == true &&
                 (uVar3 = ((puVar27->_M_t).
                           super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                           .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl)->
                          ip, uVar3 != 0)) && (((uVar3 ^ player->ip32) & uVar12) == 0)))) {
LAB_00133bee:
              pPVar33 = (PlayerInfo *)
                        (puVar27->_M_t).
                        super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                        .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
              uVar2 = *(ushort *)((long)&pPVar33->name + 8);
              player->ban_flags = player->ban_flags | uVar2;
              if ((char)uVar2 < '\0') {
                pPVar19 = pPVar33;
                if (pPVar26 != (PlayerInfo *)0x0) {
                  lVar21 = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
                  lVar15 = ((seconds *)((long)&pPVar33->name + 0x18))->__r;
                  if (lVar21 == 0) {
                    if ((lVar15 != 0) ||
                       ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity <=
                        (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))
                    goto LAB_00133c03;
                  }
                  else if ((lVar15 == 0) ||
                          (pPVar19 = pPVar26,
                          (long)(lVar21 * 1000000000 +
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity) <
                          (long)(lVar15 * 1000000000 +
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))) {
                    pPVar19 = pPVar33;
                  }
                }
              }
              else {
LAB_00133c03:
                pPVar19 = pPVar26;
              }
              pPVar31 = pPVar32;
              if (((uVar2 & 0x40) != 0) && (pPVar31 = pPVar33, pPVar32 != (PlayerInfo *)0x0)) {
                lVar21 = ((seconds *)((long)&pPVar32->name + 0x18))->__r;
                lVar15 = ((seconds *)((long)&pPVar33->name + 0x18))->__r;
                if (lVar21 == 0) {
                  if ((lVar15 != 0) ||
                     ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar32->name + 0x10))->_M_allocated_capacity <=
                      (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity)) {
                    pPVar31 = pPVar32;
                  }
                }
                else if ((lVar15 == 0) ||
                        (pPVar31 = pPVar32,
                        (long)(lVar21 * 1000000000 +
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar32->name + 0x10))->_M_allocated_capacity) <
                        (long)(lVar15 * 1000000000 +
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))) {
                  pPVar31 = pPVar33;
                }
              }
              if ((uVar2 & 0x20) == 0) {
LAB_00133cec:
                pPVar29 = pPVar17;
              }
              else {
                pPVar29 = pPVar33;
                if (pPVar17 != (PlayerInfo *)0x0) {
                  lVar21 = ((seconds *)((long)&pPVar17->name + 0x18))->__r;
                  lVar15 = ((seconds *)((long)&pPVar33->name + 0x18))->__r;
                  if (lVar21 == 0) {
                    if ((lVar15 != 0) ||
                       ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar17->name + 0x10))->_M_allocated_capacity <=
                        (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))
                    goto LAB_00133cec;
                  }
                  else if ((lVar15 == 0) ||
                          (pPVar29 = pPVar17,
                          (long)(lVar21 * 1000000000 +
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar17->name + 0x10))->_M_allocated_capacity) <
                          (long)(lVar15 * 1000000000 +
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))) {
                    pPVar29 = pPVar33;
                  }
                }
              }
              pPVar17 = pPVar29;
              pPVar30 = local_188;
              if (((uVar2 & 0x10) != 0) && (pPVar30 = pPVar33, local_188 != (PlayerInfo *)0x0)) {
                lVar21 = ((seconds *)((long)&local_188->name + 0x18))->__r;
                lVar15 = ((seconds *)((long)&pPVar33->name + 0x18))->__r;
                if (lVar21 == 0) {
                  pPVar30 = local_188;
                  if ((lVar15 == 0) &&
                     (pPVar30 = pPVar33,
                     (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&local_188->name + 0x10))->_M_allocated_capacity <=
                     (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity)) {
                    pPVar30 = local_188;
                  }
                }
                else if ((lVar15 == 0) ||
                        (pPVar30 = local_188,
                        (long)(lVar21 * 1000000000 +
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&local_188->name + 0x10))->_M_allocated_capacity) <
                        (long)(lVar15 * 1000000000 +
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))) {
                  pPVar30 = pPVar33;
                }
              }
              pPVar29 = local_198;
              if (((uVar2 & 8) != 0) && (pPVar29 = pPVar33, local_198 != (PlayerInfo *)0x0)) {
                lVar21 = ((seconds *)((long)&local_198->name + 0x18))->__r;
                lVar15 = ((seconds *)((long)&pPVar33->name + 0x18))->__r;
                if (lVar21 == 0) {
                  pPVar29 = local_198;
                  if ((lVar15 == 0) &&
                     (pPVar29 = pPVar33,
                     (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&local_198->name + 0x10))->_M_allocated_capacity <=
                     (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity)) {
                    pPVar29 = local_198;
                  }
                }
                else if ((lVar15 == 0) ||
                        (pPVar29 = local_198,
                        (long)(lVar21 * 1000000000 +
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&local_198->name + 0x10))->_M_allocated_capacity) <
                        (long)(lVar15 * 1000000000 +
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))) {
                  pPVar29 = pPVar33;
                }
              }
              pPVar26 = pPVar25;
              if (((uVar2 & 4) != 0) && (pPVar26 = pPVar33, pPVar25 != (PlayerInfo *)0x0)) {
                lVar21 = *(long *)((long)&(pPVar25->name).field_2 + 8);
                lVar15 = ((seconds *)((long)&pPVar33->name + 0x18))->__r;
                if (lVar21 == 0) {
                  pPVar26 = pPVar25;
                  if ((lVar15 == 0) &&
                     (pPVar26 = pPVar33,
                     (long)(pPVar25->name).field_2._M_allocated_capacity <=
                     (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity)) {
                    pPVar26 = pPVar25;
                  }
                }
                else if ((lVar15 == 0) ||
                        (pPVar26 = pPVar25,
                        (long)(lVar21 * 1000000000 + (pPVar25->name).field_2._M_allocated_capacity)
                        < (long)(lVar15 * 1000000000 +
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity))) {
                  pPVar26 = pPVar33;
                }
              }
              puVar24 = local_1a0;
              pPVar25 = pPVar26;
              pPVar26 = pPVar19;
              pPVar32 = pPVar31;
              pPVar19 = local_190;
              if ((uVar2 & 2) != 0) {
                if (local_190 == (PlayerInfo *)0x0) {
LAB_00133e61:
                  pPVar19 = pPVar33;
                }
                else {
                  lVar21 = ((seconds *)((long)&local_190->name + 0x18))->__r;
                  lVar15 = ((seconds *)((long)&pPVar33->name + 0x18))->__r;
                  if (lVar21 == 0) {
                    if ((lVar15 == 0) &&
                       (pPVar19 = pPVar33,
                       (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&local_190->name + 0x10))->_M_allocated_capacity <=
                       (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity)) {
                      pPVar19 = local_190;
                    }
                  }
                  else if ((lVar15 == 0) ||
                          ((long)(lVar21 * 1000000000 +
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)((long)&local_190->name + 0x10))->_M_allocated_capacity) <
                           (long)(lVar15 * 1000000000 +
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)((long)&pPVar33->name + 0x10))->_M_allocated_capacity)))
                  goto LAB_00133e61;
                }
              }
            }
            else {
              if (local_180->m_localHWIDBan == true) {
                pEVar4 = (puVar27->_M_t).
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
                sVar22 = (pEVar4->hwid)._M_string_length;
                if (((sVar22 != 0) && (sVar22 == (player->hwid)._M_string_length)) &&
                   (iVar13 = bcmp((pEVar4->hwid)._M_dataplus._M_p,(player->hwid)._M_dataplus._M_p,
                                  sVar22), iVar13 == 0)) goto LAB_00133bee;
              }
              if (((local_180->m_localRDNSBan == true) &&
                  (pEVar4 = (puVar27->_M_t).
                            super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                            .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
                  (pEVar4->rdns)._M_string_length != 0)) && ((pEVar4->flags & 0x4000) != 0)) {
                p_Var7 = (player->m_rdns_ptr).
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                if (((p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                    (p_Var7->_M_use_count != 1)) ||
                   (peVar8 = (player->m_rdns_ptr).
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr, peVar8 == (element_type *)0x0)) {
                  local_138[0]._M_len = 0;
                  local_138[0]._M_str = (pointer)0x0;
                }
                else {
                  local_138[0]._M_str = (peVar8->_M_dataplus)._M_p;
                  local_138[0]._M_len = peVar8->_M_string_length;
                }
                pEVar4 = (puVar27->_M_t).
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
                sVar16 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                   (local_138,(pEVar4->rdns)._M_dataplus._M_p,0,
                                    (pEVar4->rdns)._M_string_length);
                if (sVar16 != 0xffffffffffffffff) goto LAB_00133bee;
              }
              puVar24 = local_1a0;
              pPVar29 = local_198;
              pPVar30 = local_188;
              pPVar19 = local_190;
              if (local_180->m_localNameBan == true) {
                pEVar4 = (puVar27->_M_t).
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
                sVar9 = (pEVar4->name)._M_string_length;
                if ((sVar9 != 0) &&
                   (lhs._M_str = (pEVar4->name)._M_dataplus._M_p, lhs._M_len = sVar9,
                   rhs._M_str = (player->name)._M_dataplus._M_p,
                   rhs._M_len = (player->name)._M_string_length,
                   bVar10 = jessilib::equalsi<char,char>(lhs,rhs), puVar24 = local_1a0,
                   pPVar29 = local_198, pPVar30 = local_188, pPVar19 = local_190, bVar10))
                goto LAB_00133bee;
              }
            }
          }
          else {
            BanDatabase::deactivate
                      ((BanDatabase *)banDatabase,
                       (puVar27->_M_t).
                       super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                       .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl);
            puVar24 = local_1a0;
            pPVar29 = local_198;
            pPVar30 = local_188;
            pPVar19 = local_190;
          }
        }
        local_190 = pPVar19;
        puVar27 = puVar27 + 1;
        pPVar19 = pPVar25;
      } while (puVar27 != puVar24);
    }
    pSVar34 = local_180;
    pPVar33 = local_190;
    if (pPVar26 == (PlayerInfo *)0x0) {
      if (pPVar32 == (PlayerInfo *)0x0) {
        if (pPVar17 != (PlayerInfo *)0x0) {
          local_178._M_dataplus._M_p =
               (pointer)((long)(((seconds *)((long)&pPVar17->name + 0x18))->__r * 1000000000 +
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)&pPVar17->name + 0x10))->_M_allocated_capacity) /
                        1000000000);
          ptVar18 = localtime((time_t *)&local_178);
          strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar18);
          if (((seconds *)((long)&pPVar17->name + 0x18))->__r == 0) {
            string_printf_abi_cxx11_
                      (&local_1c0,"You were permanently bot-muted from %.*s on %s for: %.*s",
                       (pSVar34->m_ban_from_str)._M_string_length,
                       (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar17->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar17->vehicle + 0x10))->_M_allocated_capacity);
            message_08._M_str = local_1c0._M_dataplus._M_p;
            message_08._M_len = local_1c0._M_string_length;
            sendMessage(pSVar34,player,message_08);
            pPVar25 = extraout_RDX_13;
          }
          else {
            string_printf_abi_cxx11_
                      (&local_1c0,"You are bot-muted from %.*s until %s for: %.*s",
                       (pSVar34->m_ban_from_str)._M_string_length,
                       (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar17->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar17->vehicle + 0x10))->_M_allocated_capacity);
            message_00._M_str = local_1c0._M_dataplus._M_p;
            message_00._M_len = local_1c0._M_string_length;
            sendMessage(pSVar34,player,message_00);
            pPVar25 = extraout_RDX_01;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
            pPVar25 = extraout_RDX_14;
          }
        }
      }
      else {
        local_178._M_dataplus._M_p =
             (pointer)((long)(((seconds *)((long)&pPVar32->name + 0x18))->__r * 1000000000 +
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&pPVar32->name + 0x10))->_M_allocated_capacity) / 1000000000
                      );
        ptVar18 = localtime((time_t *)&local_178);
        strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar18);
        mute(pSVar34,player);
        pPVar33 = local_190;
        if (((seconds *)((long)&pPVar32->name + 0x18))->__r == 0) {
          string_printf_abi_cxx11_
                    (&local_1c0,"You were permanently muted from %.*s on %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar32->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar32->vehicle + 0x10))->_M_allocated_capacity);
          message_01._M_str = local_1c0._M_dataplus._M_p;
          message_01._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message_01);
          pPVar25 = extraout_RDX_02;
        }
        else {
          string_printf_abi_cxx11_
                    (&local_1c0,"You are muted from %.*s until %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar32->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar32->vehicle + 0x10))->_M_allocated_capacity);
          message._M_str = local_1c0._M_dataplus._M_p;
          message._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message);
          pPVar25 = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          pPVar25 = extraout_RDX_03;
        }
        *(byte *)&player->ban_flags = (byte)player->ban_flags | 0x20;
      }
      if (pPVar30 != (PlayerInfo *)0x0) {
        local_178._M_dataplus._M_p =
             (pointer)((long)(((seconds *)((long)&pPVar30->name + 0x18))->__r * 1000000000 +
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&pPVar30->name + 0x10))->_M_allocated_capacity) / 1000000000
                      );
        ptVar18 = localtime((time_t *)&local_178);
        strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar18);
        if (((seconds *)((long)&pPVar30->name + 0x18))->__r == 0) {
          string_printf_abi_cxx11_
                    (&local_1c0,"You were permanently vote-muted from %.*s on %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar30->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar30->vehicle + 0x10))->_M_allocated_capacity);
          message_03._M_str = local_1c0._M_dataplus._M_p;
          message_03._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message_03);
          pPVar25 = extraout_RDX_05;
        }
        else {
          string_printf_abi_cxx11_
                    (&local_1c0,"You are vote-muted from %.*s until %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar30->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar30->vehicle + 0x10))->_M_allocated_capacity);
          message_02._M_str = local_1c0._M_dataplus._M_p;
          message_02._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message_02);
          pPVar25 = extraout_RDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          pPVar25 = extraout_RDX_06;
        }
      }
      if (pPVar29 != (PlayerInfo *)0x0) {
        local_178._M_dataplus._M_p =
             (pointer)((long)(((seconds *)((long)&pPVar29->name + 0x18))->__r * 1000000000 +
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&pPVar29->name + 0x10))->_M_allocated_capacity) / 1000000000
                      );
        mineBan(pSVar34,player->id);
        ptVar18 = localtime((time_t *)&local_178);
        strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar18);
        if (((seconds *)((long)&pPVar29->name + 0x18))->__r == 0) {
          string_printf_abi_cxx11_
                    (&local_1c0,"You were permanently mine-banned from %.*s on %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar29->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar29->vehicle + 0x10))->_M_allocated_capacity);
          message_05._M_str = local_1c0._M_dataplus._M_p;
          message_05._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message_05);
          pPVar25 = extraout_RDX_08;
        }
        else {
          string_printf_abi_cxx11_
                    (&local_1c0,"You are mine-banned from %.*s until %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar29->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar29->vehicle + 0x10))->_M_allocated_capacity);
          message_04._M_str = local_1c0._M_dataplus._M_p;
          message_04._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message_04);
          pPVar25 = extraout_RDX_07;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          pPVar25 = extraout_RDX_09;
        }
      }
      if (pPVar19 != (PlayerInfo *)0x0) {
        local_178._M_dataplus._M_p =
             (pointer)((long)(*(long *)((long)&(pPVar19->name).field_2 + 8) * 1000000000 +
                             (pPVar19->name).field_2._M_allocated_capacity) / 1000000000);
        ptVar18 = localtime((time_t *)&local_178);
        strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar18);
        if (*(long *)((long)&(pPVar19->name).field_2 + 8) == 0) {
          string_printf_abi_cxx11_
                    (&local_1c0,"You were permanently ladder-banned from %.*s on %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     *(undefined8 *)((long)&pPVar19->vehicle + 0x18),
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pPVar19->vehicle)[1]._M_allocated_capacity);
          message_07._M_str = local_1c0._M_dataplus._M_p;
          message_07._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message_07);
          pPVar25 = extraout_RDX_11;
        }
        else {
          string_printf_abi_cxx11_
                    (&local_1c0,"You are ladder-banned from %.*s until %s for: %.*s",
                     (pSVar34->m_ban_from_str)._M_string_length,
                     (pSVar34->m_ban_from_str)._M_dataplus._M_p,local_138,
                     *(undefined8 *)((long)&pPVar19->vehicle + 0x18),
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pPVar19->vehicle)[1]._M_allocated_capacity);
          message_06._M_str = local_1c0._M_dataplus._M_p;
          message_06._M_len = local_1c0._M_string_length;
          sendMessage(pSVar34,player,message_06);
          pPVar25 = extraout_RDX_10;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          pPVar25 = extraout_RDX_12;
        }
      }
      if (pPVar33 != (PlayerInfo *)0x0) {
        getFormattedPlayerName_abi_cxx11_(&local_1c0,(RenX *)player,pPVar25);
        string_printf_abi_cxx11_
                  (&local_178,
                   "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in "
                   ,local_1c0._M_string_length,local_1c0._M_dataplus._M_p,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&pPVar33->character + 0x18))->_M_allocated_capacity,
                   (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar33->character + 0x10))->_M_allocated_capacity,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&pPVar33->vehicle + 0x18))->_M_allocated_capacity,
                   (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar33->vehicle + 0x10))->_M_allocated_capacity);
        string_printf_abi_cxx11_
                  (&local_158,
                   "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\".\x03"
                   ,local_1c0._M_string_length,local_1c0._M_dataplus._M_p,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&pPVar33->character + 0x18))->_M_allocated_capacity,
                   (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar33->character + 0x10))->_M_allocated_capacity,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&pPVar33->vehicle + 0x18))->_M_allocated_capacity,
                   (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar33->vehicle + 0x10))->_M_allocated_capacity);
        pPVar25 = (PlayerInfo *)0x0;
        while (pPVar19 = (PlayerInfo *)ServerManager::size(), pPVar25 < pPVar19) {
          uVar20 = ServerManager::getServer(_serverManager);
          local_198 = pPVar25;
          lVar21 = Jupiter::IRC::Client::getChannels_abi_cxx11_();
          for (puVar35 = *(undefined8 **)(lVar21 + 0x10); puVar35 != (undefined8 *)0x0;
              puVar35 = (undefined8 *)*puVar35) {
            iVar13 = Jupiter::IRC::Client::Channel::getType();
            if (pSVar34->m_adminLogChanType == iVar13) {
              auVar36 = Jupiter::IRC::Client::Channel::getName();
              Jupiter::IRC::Client::sendMessage
                        (uVar20,auVar36._0_8_,auVar36._8_8_,local_158._M_string_length,
                         local_158._M_dataplus._M_p);
              sVar9 = local_178._M_string_length;
              auVar36 = Jupiter::IRC::Client::Channel::getName();
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_178,auVar36._8_8_,auVar36._0_8_);
              lVar21 = Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
              for (puVar28 = *(undefined8 **)(lVar21 + 0x10); puVar28 != (undefined8 *)0x0;
                  puVar28 = (undefined8 *)*puVar28) {
                cVar11 = Jupiter::IRC::Client::Channel::getUserPrefix((User *)(puVar35 + 5));
                if (cVar11 != '\0') {
                  auVar36 = Jupiter::IRC::Client::getNickname();
                  sVar22 = auVar36._0_8_;
                  puVar23 = (undefined8 *)
                            Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_();
                  if ((sVar22 != puVar23[1]) ||
                     ((sVar22 != 0 &&
                      (iVar13 = bcmp(auVar36._8_8_,(void *)*puVar23,sVar22), iVar13 != 0)))) {
                    Jupiter::IRC::Client::Channel::User::getUser();
                    puVar23 = (undefined8 *)Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
                    Jupiter::IRC::Client::sendMessage
                              (uVar20,puVar23[1],*puVar23,local_178._M_string_length,
                               local_178._M_dataplus._M_p);
                  }
                }
              }
              if (local_178._M_string_length < sVar9) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
              }
              local_178._M_dataplus._M_p[sVar9] = '\0';
              pSVar34 = local_180;
              local_178._M_string_length = sVar9;
            }
          }
          pPVar25 = (PlayerInfo *)((long)&((fpos_t *)&local_198->joinTime)->__pos + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      local_178._M_dataplus._M_p =
           (pointer)((long)(((seconds *)((long)&pPVar26->name + 0x18))->__r * 1000000000 +
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity) / 1000000000);
      ptVar18 = localtime((time_t *)&local_178);
      strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar18);
      pSVar34 = local_180;
      if (((seconds *)((long)&pPVar26->name + 0x18))->__r == 0) {
        string_printf_abi_cxx11_
                  (&local_1c0,"You were permanently banned from %.*s on %s for: %.*s",
                   (local_180->m_ban_from_str)._M_string_length,
                   (local_180->m_ban_from_str)._M_dataplus._M_p,local_138,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&pPVar26->vehicle + 0x18))->_M_allocated_capacity,
                   (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->vehicle + 0x10))->_M_allocated_capacity);
        if ((player->exemption_flags & 4) == 0) {
          in_reason_00._M_str = local_1c0._M_dataplus._M_p;
          in_reason_00._M_len = local_1c0._M_string_length;
          forceKickPlayer(pSVar34,player->id,in_reason_00);
        }
      }
      else {
        string_printf_abi_cxx11_
                  (&local_1c0,"You are banned from %.*s until %s for: %.*s",
                   (local_180->m_ban_from_str)._M_string_length,
                   (local_180->m_ban_from_str)._M_dataplus._M_p,local_138,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&pPVar26->vehicle + 0x18))->_M_allocated_capacity,
                   (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->vehicle + 0x10))->_M_allocated_capacity);
        if ((player->exemption_flags & 4) == 0) {
          in_reason._M_str = local_1c0._M_dataplus._M_p;
          in_reason._M_len = local_1c0._M_string_length;
          forceKickPlayer(pSVar34,player->id,in_reason);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      *(byte *)&player->ban_flags = (byte)player->ban_flags | 0x20;
    }
  }
  return;
}

Assistant:

void RenX::Server::banCheck(RenX::PlayerInfo &player) {
	if ((player.exemption_flags & (RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK)) != 0) {
		return;
	}

	uint32_t netmask;

	RenX::BanDatabase::Entry* last_to_expire[7]; // TODO: what the fuck is this?
	for (size_t index = 0; index != sizeof(last_to_expire) / sizeof(RenX::BanDatabase::Entry *); ++index)
		last_to_expire[index] = nullptr;

	auto handle_type = [&last_to_expire](RenX::BanDatabase::Entry* entry, size_t index) {
		if (last_to_expire[index] == nullptr) {
			last_to_expire[index] = entry;
		}
		else if (last_to_expire[index]->length == std::chrono::seconds::zero()) {
			// favor older bans if they're also permanent
			if (entry->length == std::chrono::seconds::zero() && entry->timestamp < last_to_expire[index]->timestamp) {
				last_to_expire[index] = entry;
			}
		}
		else if (entry->length == std::chrono::seconds::zero() || entry->timestamp + entry->length > last_to_expire[index]->timestamp + last_to_expire[index]->length) {
			last_to_expire[index] = entry;
		}
	};

	for (const auto& entry : RenX::banDatabase->getEntries()) {
		if (entry->is_active()) {
			if (entry->length != std::chrono::seconds::zero() && entry->timestamp + entry->length < std::chrono::system_clock::now()) {
				banDatabase->deactivate(entry.get());
			}
			else {
				if (entry->prefix_length >= 32) {
					netmask = 0xFFFFFFFF;
				}
				else {
					netmask = Jupiter_prefix_length_to_netmask(entry->prefix_length);
				}

				if ((m_localSteamBan && entry->steamid != 0 && entry->steamid == player.steamid)
					|| (m_localIPBan && entry->ip != 0 && (entry->ip & netmask) == (player.ip32 & netmask))
					|| (m_localHWIDBan && !entry->hwid.empty() && entry->hwid == player.hwid)
					|| (m_localRDNSBan && !entry->rdns.empty() && entry->is_rdns_ban() && player.get_rdns().find(entry->rdns) != std::string::npos)
					|| (m_localNameBan && !entry->name.empty() && jessilib::equalsi(entry->name, player.name))) {
					player.ban_flags |= entry->flags;
					if (entry->is_type_game())
						handle_type(entry.get(), 0);
					if (entry->is_type_chat())
						handle_type(entry.get(), 1);
					if (entry->is_type_bot())
						handle_type(entry.get(), 2);
					if (entry->is_type_vote())
						handle_type(entry.get(), 3);
					if (entry->is_type_mine())
						handle_type(entry.get(), 4);
					if (entry->is_type_ladder())
						handle_type(entry.get(), 5);
					if (entry->is_type_alert())
						handle_type(entry.get(), 6);
				}
			}
		}
	}

	char timeStr[256];
	if (last_to_expire[0] != nullptr) { // Game ban
		time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[0]->timestamp + last_to_expire[0]->length);
		strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
		if (last_to_expire[0]->length == std::chrono::seconds::zero()) {
			forceKickPlayer(player, string_printf("You were permanently banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}
		else {
			forceKickPlayer(player, string_printf("You are banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}

		player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
	}
	else {
		if (last_to_expire[1] != nullptr) { // Chat ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[1]->timestamp + last_to_expire[1]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			mute(player);
			if (last_to_expire[1]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));
			else
				sendMessage(player, string_printf("You are muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));

			player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
		}
		else if (last_to_expire[2] != nullptr) { // Bot ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[2]->timestamp + last_to_expire[2]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[2]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently bot-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
			else
				sendMessage(player, string_printf("You are bot-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
		}
		if (last_to_expire[3] != nullptr) { // Vote ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[3]->timestamp + last_to_expire[3]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[3]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently vote-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
			else
				sendMessage(player, string_printf("You are vote-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
		}
		if (last_to_expire[4] != nullptr) { // Mine ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[4]->timestamp + last_to_expire[4]->length);
			mineBan(player);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[4]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently mine-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
			else
				sendMessage(player, string_printf("You are mine-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
		}
		if (last_to_expire[5] != nullptr) { // Ladder ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[5]->timestamp + last_to_expire[5]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[5]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently ladder-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
			else
				sendMessage(player, string_printf("You are ladder-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
		}
		if (last_to_expire[6] != nullptr) { // Alert
			IRC_Bot *server;
			std::string fmtName = RenX::getFormattedPlayerName(player);
			std::string user_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in ", fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());
			std::string channel_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\"." IRCCOLOR, fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());

			for (size_t server_index = 0; server_index < serverManager->size(); ++server_index) {
				server = serverManager->getServer(server_index);
				for (auto& channel : server->getChannels()) {
					if (isAdminLogChanType(channel.second.getType())) {
						server->sendMessage(channel.second.getName(), channel_message);

						size_t base_length = user_message.size();
						user_message += channel.second.getName();
						for (auto& user : channel.second.getUsers()) {
							if (channel.second.getUserPrefix(*user.second) != 0 && user.second->getNickname() != server->getNickname())
								server->sendMessage(user.second->getUser()->getNickname(), user_message);
						}
						user_message.erase(base_length);
					}
				}
			}
		}
	}
}